

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Table_InsertOverloads_Test::~Table_InsertOverloads_Test
          (Table_InsertOverloads_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, InsertOverloads) {
  StringTable t;
  // These should all trigger the insert(init_type) overload.
  t.insert({{}, {}});
  t.insert({"ABC", {}});
  t.insert({"DEF", "!!!"});

  EXPECT_THAT(t, UnorderedElementsAre(Pair("", ""), Pair("ABC", ""),
                                      Pair("DEF", "!!!")));
}